

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::EndQuery(QueryProfiler *this)

{
  unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true> *this_00;
  profiler_metrics_t *this_01;
  double val;
  bool bVar1;
  pointer pPVar2;
  ProfilingNode *node;
  pointer pPVar3;
  reference this_02;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  type pPVar6;
  char cVar7;
  QueryProfiler *this_03;
  __node_base *p_Var8;
  profiler_settings_t *settings;
  allocator local_1a1;
  pointer local_1a0;
  string save_location;
  unique_lock<std::mutex> guard;
  string local_168;
  string local_148;
  string tree;
  
  ::std::unique_lock<std::mutex>::unique_lock(&guard,&this->lock);
  if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true)) &&
     (this->running == true)) {
    BaseProfiler<std::chrono::_V2::steady_clock>::End(&this->main_query);
    this_00 = &this->root;
    if ((this->root).
        super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
        super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
        .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl != (ProfilingNode *)0x0)
    {
      pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(this_00);
      bVar1 = ProfilingInfo::Enabled
                        (&(pPVar2->profiling_info).expanded_settings,OPERATOR_CARDINALITY);
      if (bVar1) {
        pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator->(this_00);
        tree._M_dataplus._M_p = (pointer)ProfilingNode::GetChild(pPVar2,0);
        node = optional_ptr<duckdb::ProfilingNode,_true>::operator*
                         ((optional_ptr<duckdb::ProfilingNode,_true> *)&tree);
        Finalize(this,node);
      }
    }
    this->running = false;
    if ((this->is_explain_analyze == false) && ((this->context->config).enable_profiler == true)) {
      if ((this_00->
          super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>)._M_t
          .super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
          .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl !=
          (ProfilingNode *)0x0) {
        pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator->(this_00);
        ProfilingInfo::ProfilingInfo
                  ((ProfilingInfo *)&tree,&(this->context->config).profiler_settings,0);
        ProfilingInfo::operator=(&pPVar2->profiling_info,(ProfilingInfo *)&tree);
        ProfilingInfo::~ProfilingInfo((ProfilingInfo *)&tree);
        pPVar3 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator->(this_00);
        this_02 = vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
                  ::get<true>(&pPVar3->children,0);
        local_1a0 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                    ::operator->(this_02);
        ::std::__cxx11::string::string((string *)&local_148,(string *)&this->query_info);
        Value::Value((Value *)&tree,&local_148);
        this_01 = &(pPVar2->profiling_info).metrics;
        save_location._M_dataplus._M_p._0_1_ = 0;
        pmVar4 = ::std::__detail::
                 _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,(key_type *)&save_location);
        Value::operator=(pmVar4,(Value *)&tree);
        Value::~Value((Value *)&tree);
        ::std::__cxx11::string::~string((string *)&local_148);
        settings = &(pPVar2->profiling_info).expanded_settings;
        p_Var8 = &(this->query_info).query_global_info.metrics._M_h._M_before_begin;
        while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,(key_type *)(p_Var8 + 1));
          Value::operator=(pmVar4,(Value *)(p_Var8 + 2));
        }
        bVar1 = ProfilingInfo::Enabled(settings,LATENCY);
        if (bVar1) {
          val = BaseProfiler<std::chrono::_V2::steady_clock>::Elapsed(&this->main_query);
          Value::Value((Value *)&tree,val);
          save_location._M_dataplus._M_p._0_1_ = 0xb;
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,(key_type *)&save_location);
          Value::operator=(pmVar4,(Value *)&tree);
          Value::~Value((Value *)&tree);
        }
        bVar1 = ProfilingInfo::Enabled(settings,ROWS_RETURNED);
        if (bVar1) {
          tree._M_dataplus._M_p._0_1_ = 6;
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(local_1a0->profiling_info).metrics,(key_type *)&tree);
          save_location._M_dataplus._M_p._0_1_ = 0xc;
          pmVar5 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,(key_type *)&save_location);
          Value::operator=(pmVar5,pmVar4);
        }
        bVar1 = ProfilingInfo::Enabled(settings,CPU_TIME);
        if (bVar1) {
          pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                   ::operator*(this_00);
          tree._M_dataplus._M_p = (pointer)0x0;
          tree._M_string_length = 0;
          tree.field_2._8_8_ =
               ::std::
               _Function_handler<double_(const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/query_profiler.cpp:197:6)>
               ::_M_invoke;
          tree.field_2._M_allocated_capacity =
               (size_type)
               ::std::
               _Function_handler<double_(const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/query_profiler.cpp:197:6)>
               ::_M_manager;
          AggregateMetric<double>
                    (pPVar6,CPU_TIME,OPERATOR_TIMING,
                     (function<double_(const_double_&,_const_double_&)> *)&tree);
          ::std::_Function_base::~_Function_base((_Function_base *)&tree);
        }
        bVar1 = ProfilingInfo::Enabled(settings,CUMULATIVE_CARDINALITY);
        if (bVar1) {
          pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                   ::operator*(this_00);
          GetCumulativeMetric<unsigned_long>(pPVar6,CUMULATIVE_CARDINALITY,OPERATOR_CARDINALITY);
        }
        bVar1 = ProfilingInfo::Enabled(settings,CUMULATIVE_ROWS_SCANNED);
        if (bVar1) {
          pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                   ::operator*(this_00);
          GetCumulativeMetric<unsigned_long>(pPVar6,CUMULATIVE_ROWS_SCANNED,OPERATOR_ROWS_SCANNED);
        }
        bVar1 = ProfilingInfo::Enabled(settings,RESULT_SET_SIZE);
        if (bVar1) {
          tree._M_dataplus._M_p._0_1_ = 10;
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(local_1a0->profiling_info).metrics,(key_type *)&tree);
          save_location._M_dataplus._M_p._0_1_ = 10;
          pmVar5 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,(key_type *)&save_location);
          Value::operator=(pmVar5,pmVar4);
        }
        MoveOptimizerPhasesToRoot(this);
        bVar1 = ProfilingInfo::Enabled(settings,CUMULATIVE_OPTIMIZER_TIMING);
        if (bVar1) {
          pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                   ::operator*(this_00);
          GetCumulativeOptimizers((Value *)&tree,pPVar6);
          save_location._M_dataplus._M_p._0_1_ = 0x11;
          pmVar4 = ::std::__detail::
                   _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&save_location);
          Value::operator=(pmVar4,(Value *)&tree);
          Value::~Value((Value *)&tree);
        }
      }
      cVar7 = (this->context->config).emit_profiler_output;
    }
    else {
      cVar7 = '\0';
    }
    this->is_explain_analyze = false;
    ::std::unique_lock<std::mutex>::unlock(&guard);
    if (cVar7 != '\0') {
      ToString_abi_cxx11_(&tree,this,DEFAULT);
      this_03 = (QueryProfiler *)&save_location;
      GetSaveLocation_abi_cxx11_((string *)this_03,this);
      if (save_location._M_string_length == 0) {
        Printer::Print((string *)&tree);
        ::std::__cxx11::string::string((string *)&local_168,anon_var_dwarf_3b2a754 + 8,&local_1a1);
        Printer::Print(&local_168);
        ::std::__cxx11::string::~string((string *)&local_168);
      }
      else {
        WriteToFile(this_03,(char *)CONCAT71(save_location._M_dataplus._M_p._1_7_,
                                             save_location._M_dataplus._M_p._0_1_),&tree);
      }
      ::std::__cxx11::string::~string((string *)&save_location);
      ::std::__cxx11::string::~string((string *)&tree);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void QueryProfiler::EndQuery() {
	unique_lock<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}

	main_query.End();
	if (root) {
		auto &info = root->GetProfilingInfo();
		if (info.Enabled(info.expanded_settings, MetricsType::OPERATOR_CARDINALITY)) {
			Finalize(*root->GetChild(0));
		}
	}
	running = false;

	bool emit_output = false;

	// Print or output the query profiling after query termination.
	// EXPLAIN ANALYZE output is not written by the profiler.
	if (IsEnabled() && !is_explain_analyze) {
		if (root) {
			auto &info = root->GetProfilingInfo();
			info = ProfilingInfo(ClientConfig::GetConfig(context).profiler_settings);
			auto &child_info = root->children[0]->GetProfilingInfo();
			info.metrics[MetricsType::QUERY_NAME] = query_info.query_name;

			auto &settings = info.expanded_settings;
			for (const auto &global_info_entry : query_info.query_global_info.metrics) {
				info.metrics[global_info_entry.first] = global_info_entry.second;
			}
			if (info.Enabled(settings, MetricsType::LATENCY)) {
				info.metrics[MetricsType::LATENCY] = main_query.Elapsed();
			}
			if (info.Enabled(settings, MetricsType::ROWS_RETURNED)) {
				info.metrics[MetricsType::ROWS_RETURNED] = child_info.metrics[MetricsType::OPERATOR_CARDINALITY];
			}
			if (info.Enabled(settings, MetricsType::CPU_TIME)) {
				GetCumulativeMetric<double>(*root, MetricsType::CPU_TIME, MetricsType::OPERATOR_TIMING);
			}
			if (info.Enabled(settings, MetricsType::CUMULATIVE_CARDINALITY)) {
				GetCumulativeMetric<idx_t>(*root, MetricsType::CUMULATIVE_CARDINALITY,
				                           MetricsType::OPERATOR_CARDINALITY);
			}
			if (info.Enabled(settings, MetricsType::CUMULATIVE_ROWS_SCANNED)) {
				GetCumulativeMetric<idx_t>(*root, MetricsType::CUMULATIVE_ROWS_SCANNED,
				                           MetricsType::OPERATOR_ROWS_SCANNED);
			}
			if (info.Enabled(settings, MetricsType::RESULT_SET_SIZE)) {
				info.metrics[MetricsType::RESULT_SET_SIZE] = child_info.metrics[MetricsType::RESULT_SET_SIZE];
			}

			MoveOptimizerPhasesToRoot();
			if (info.Enabled(settings, MetricsType::CUMULATIVE_OPTIMIZER_TIMING)) {
				info.metrics.at(MetricsType::CUMULATIVE_OPTIMIZER_TIMING) = GetCumulativeOptimizers(*root);
			}
		}

		if (ClientConfig::GetConfig(context).emit_profiler_output) {
			emit_output = true;
		}
	}

	is_explain_analyze = false;

	guard.unlock();

	if (emit_output) {
		string tree = ToString();
		auto save_location = GetSaveLocation();

		if (save_location.empty()) {
			Printer::Print(tree);
			Printer::Print("\n");
		} else {
			WriteToFile(save_location.c_str(), tree);
		}
	}
}